

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<kj::TreeMap<kj::String,_int>::Entry_&> __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::find<0ul,kj::StringPtr>
          (Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
           *this,char (*params) [7])

{
  long lVar1;
  ArrayPtr<kj::TreeMap<kj::String,_int>::Entry> table;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks> local_28 [8];
  long local_20;
  
  table.ptr = params[4] + 4;
  table.size_ = *(size_t *)params;
  TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>::
  find<kj::TreeMap<kj::String,int>::Entry,kj::StringPtr>
            (local_28,table,
             (char (*) [7])((long)(*(long *)(params[1] + 1) - *(size_t *)params) >> 5));
  if (local_28[0] == (TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>)0x1) {
    lVar1 = local_20 * 0x20 + *(long *)params;
  }
  else {
    lVar1 = 0;
  }
  *(long *)this = lVar1;
  return (Maybe<kj::TreeMap<kj::String,_int>::Entry_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}